

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

bool __thiscall Parser::dcl(Parser *this)

{
  pointer *pppFVar1;
  iterator __position;
  bool bVar2;
  FunctionNode *f;
  FunctionNode *local_10;
  
  bVar2 = is_builtin_type(this);
  if ((bVar2) && (local_10 = function_definition(this), local_10 != (FunctionNode *)0x0)) {
    __position._M_current =
         (this->data).functions.super__Vector_base<FunctionNode_*,_std::allocator<FunctionNode_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->data).functions.super__Vector_base<FunctionNode_*,_std::allocator<FunctionNode_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<FunctionNode*,std::allocator<FunctionNode*>>::
      _M_realloc_insert<FunctionNode*const&>
                ((vector<FunctionNode*,std::allocator<FunctionNode*>> *)&(this->data).functions,
                 __position,&local_10);
    }
    else {
      *__position._M_current = local_10;
      pppFVar1 = &(this->data).functions.
                  super__Vector_base<FunctionNode_*,_std::allocator<FunctionNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppFVar1 = *pppFVar1 + 1;
    }
    return true;
  }
  return false;
}

Assistant:

bool Parser::dcl()
{
  if (is_builtin_type()) {
    FunctionNode* f = function_definition();
    if (f) {
      data.functions.push_back(f);
      return true;
    }
  }

  return false;
}